

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.c
# Opt level: O1

_Bool flexfloat_sticky_bit(flexfloat_t *a,int_fast16_t exp)

{
  fp_t fVar1;
  int iVar2;
  ulong uVar3;
  _Bool _Var4;
  
  if ((exp < 1) && (fVar1 = a->value, ((ulong)fVar1 & 0x7ff0000000000000) != 0)) {
    iVar2 = 1 - (int)exp;
    uVar3 = 0;
    if (iVar2 < 0x40) {
      uVar3 = ((ulong)fVar1 & 0xfffffffffffff) + 0x10000000000000 >> ((byte)iVar2 & 0x3f);
    }
    _Var4 = true;
    if ((0x7ffffffffffffU >> ((a->desc).frac_bits & 0x3f) & uVar3) == 0) {
      return fVar1 != 0.0 && (uVar3 & 0xfffffffffffff) == 0;
    }
  }
  else {
    _Var4 = ((ulong)a->value & 0x7ffffffffffffU >> ((a->desc).frac_bits & 0x3f)) != 0;
  }
  return _Var4;
}

Assistant:

bool flexfloat_sticky_bit(const flexfloat_t *a, int_fast16_t exp)
{
    if(exp <= 0 && EXPONENT(CAST_TO_INT(a->value)) != 0)
    {
        int shift = (- exp + 1);
        uint_t denorm = 0;
        if(shift < NUM_BITS)
            denorm = ((CAST_TO_INT(a->value) & MASK_FRAC) | MASK_FRAC_MSB) >> shift;
        return (denorm & (MASK_FRAC >> (a->desc.frac_bits + 1))) ||
               ( ((denorm & MASK_FRAC) == 0)  && (CAST_TO_INT(a->value)!=0) );
    }
    else
    {
        return CAST_TO_INT(a->value) & (MASK_FRAC >> (a->desc.frac_bits + 1));
    }
}